

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.cpp
# Opt level: O0

void __thiscall
LocalBGValueFunctionVector::LocalBGValueFunctionVector
          (LocalBGValueFunctionVector *this,
          shared_ptr<const_BayesianGameCollaborativeGraphical> *cgbg,Scope *agentScope)

{
  bool bVar1;
  reference puVar2;
  LocalBGValueFunctionInterface *in_RDI;
  size_t polsThisAg;
  Index agI;
  iterator last;
  iterator it;
  undefined4 in_stack_ffffffffffffff28;
  Index in_stack_ffffffffffffff2c;
  BayesianGameBase *in_stack_ffffffffffffff30;
  shared_ptr<const_BayesianGameCollaborativeGraphical> *in_stack_ffffffffffffff38;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff40;
  Index in_stack_ffffffffffffff44;
  LIndex in_stack_ffffffffffffff48;
  type in_stack_ffffffffffffff50;
  allocator_type local_71;
  undefined8 local_70;
  uint *local_50;
  ulong local_48;
  uint local_3c;
  uint *local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30 [6];
  
  LocalBGValueFunctionInterface::LocalBGValueFunctionInterface(in_RDI);
  in_RDI->_vptr_LocalBGValueFunctionInterface =
       (_func_int **)&PTR__LocalBGValueFunctionVector_00d06e98;
  Scope::Scope((Scope *)in_stack_ffffffffffffff30);
  boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::shared_ptr
            ((shared_ptr<const_BayesianGameCollaborativeGraphical> *)0x8cd74c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x8cd75f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x8cd772);
  Scope::operator=((Scope *)in_stack_ffffffffffffff30,
                   (Scope *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator=
            ((shared_ptr<const_BayesianGameCollaborativeGraphical> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  in_RDI[0xc]._vptr_LocalBGValueFunctionInterface = (_func_int **)0x1;
  local_30[0]._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(local_30);
    local_3c = *puVar2;
    in_stack_ffffffffffffff50 =
         boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->
                   ((shared_ptr<const_BayesianGameCollaborativeGraphical> *)(in_RDI + 4));
    in_stack_ffffffffffffff48 =
         BayesianGameBase::GetNrPolicies(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    in_stack_ffffffffffffff44 = Globals::CastLIndexToIndex(in_stack_ffffffffffffff48);
    local_48 = (ulong)in_stack_ffffffffffffff44;
    in_RDI[0xc]._vptr_LocalBGValueFunctionInterface =
         (_func_int **)((long)in_RDI[0xc]._vptr_LocalBGValueFunctionInterface * local_48);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (value_type_conflict2 *)in_stack_ffffffffffffff38);
    local_50 = (uint *)__gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)in_stack_ffffffffffffff38,
                                    (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  local_70 = 0;
  __a = &local_71;
  std::allocator<double>::allocator((allocator<double> *)0x8cd8f0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,
             (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             __a);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<double>::~allocator((allocator<double> *)0x8cd932);
  return;
}

Assistant:

LocalBGValueFunctionVector::LocalBGValueFunctionVector(
        const boost::shared_ptr<const BayesianGameCollaborativeGraphical> &cgbg, 
         Scope agentScope)
{
    _m_agentScope = agentScope;
    _m_bgcg = cgbg;

    //    we fill _m_nrIndivPols; and compute
    _m_nrJointPols = 1;
    Scope::iterator it = _m_agentScope.begin();
    Scope::iterator last = _m_agentScope.end();
    while(it != last)
    {
        Index agI = *it;
        size_t polsThisAg = CastLIndexToIndex(_m_bgcg->GetNrPolicies(agI));
        _m_nrJointPols *= polsThisAg;
        _m_nrIndivPols.push_back(polsThisAg);
        it++;
    }
    _m_values = vector<double>(_m_nrJointPols, 0.0);   
}